

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O3

void Prove_ParamsPrint(Prove_Params_t *pParams)

{
  char *pcVar1;
  char *pcVar2;
  
  puts("CEC enging parameters:");
  pcVar2 = "yes";
  pcVar1 = "yes";
  if (pParams->fUseFraiging == 0) {
    pcVar1 = "no";
  }
  printf("Fraiging enabled: %s\n",pcVar1);
  pcVar1 = "yes";
  if (pParams->fUseRewriting == 0) {
    pcVar1 = "no";
  }
  printf("Rewriting enabled: %s\n",pcVar1);
  pcVar1 = "yes";
  if (pParams->fUseBdds == 0) {
    pcVar1 = "no";
  }
  printf("BDD construction enabled: %s\n",pcVar1);
  pcVar1 = "yes";
  if (pParams->fVerbose == 0) {
    pcVar1 = "no";
  }
  printf("Verbose output enabled: %s\n",pcVar1);
  printf("Solver iterations: %d\n",(ulong)(uint)pParams->nItersMax);
  printf("Starting mitering limit: %d\n",(ulong)(uint)pParams->nMiteringLimitStart);
  printf("Multiplicative coeficient for mitering: %.2f\n",(double)pParams->nMiteringLimitMulti);
  printf("Starting number of rewriting iterations: %d\n",(ulong)(uint)pParams->nRewritingLimitStart)
  ;
  printf("Multiplicative coeficient for rewriting: %.2f\n",(double)pParams->nRewritingLimitMulti);
  printf("Starting number of conflicts in fraiging: %.2f\n",(double)pParams->nFraigingLimitMulti);
  printf("Multiplicative coeficient for fraiging: %.2f\n",(double)pParams->nRewritingLimitMulti);
  printf("BDD size limit for bailing out: %d\n",(ulong)(uint)pParams->nBddSizeLimit);
  if (pParams->fBddReorder == 0) {
    pcVar2 = "no";
  }
  printf("BDD reordering enabled: %s\n",pcVar2);
  printf("Last-gasp mitering limit: %d\n",(ulong)(uint)pParams->nMiteringLimitLast);
  printf("Total conflict limit: %d\n",(ulong)(uint)pParams->nTotalBacktrackLimit);
  printf("Total inspection limit: %d\n",(ulong)(uint)pParams->nTotalInspectLimit);
  puts("Parameter dump complete.");
  return;
}

Assistant:

void Prove_ParamsPrint( Prove_Params_t * pParams )
{
    printf( "CEC enging parameters:\n" );
    printf( "Fraiging enabled: %s\n", pParams->fUseFraiging? "yes":"no" );
    printf( "Rewriting enabled: %s\n", pParams->fUseRewriting? "yes":"no" );
    printf( "BDD construction enabled: %s\n", pParams->fUseBdds? "yes":"no" );
    printf( "Verbose output enabled: %s\n", pParams->fVerbose? "yes":"no" );
    printf( "Solver iterations: %d\n", pParams->nItersMax );
    printf( "Starting mitering limit: %d\n", pParams->nMiteringLimitStart );
    printf( "Multiplicative coeficient for mitering: %.2f\n", pParams->nMiteringLimitMulti );
    printf( "Starting number of rewriting iterations: %d\n", pParams->nRewritingLimitStart );
    printf( "Multiplicative coeficient for rewriting: %.2f\n", pParams->nRewritingLimitMulti );
    printf( "Starting number of conflicts in fraiging: %.2f\n", pParams->nFraigingLimitMulti );
    printf( "Multiplicative coeficient for fraiging: %.2f\n", pParams->nRewritingLimitMulti );
    printf( "BDD size limit for bailing out: %d\n", pParams->nBddSizeLimit );
    printf( "BDD reordering enabled: %s\n", pParams->fBddReorder? "yes":"no" );
    printf( "Last-gasp mitering limit: %d\n", pParams->nMiteringLimitLast );
    printf( "Total conflict limit: %d\n", (int)pParams->nTotalBacktrackLimit );
    printf( "Total inspection limit: %d\n", (int)pParams->nTotalInspectLimit );
    printf( "Parameter dump complete.\n" );
}